

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O2

bool DumpPeerAddresses(ArgsManager *args,AddrMan *addr)

{
  long lVar1;
  path src;
  path dest;
  bool bVar2;
  uint64_t uVar3;
  CChainParams *pCVar4;
  char *p2;
  bool bVar5;
  char *__stream;
  FILE *__stream_00;
  int source_line;
  unsigned_short *in_R8;
  LogFlags in_R9;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  Level in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  char *in_stack_fffffffffffffe00;
  char (*args_00) [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var6;
  undefined1 local_1e0 [38];
  uint16_t randv;
  path local_198;
  path pathAddr;
  path local_148;
  path local_120;
  path pathTmp;
  string tmpfn;
  HashedSourceWriter<AutoFile> hashwriter;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirNet((path *)&local_198,args);
  fs::operator/(&pathAddr,(path *)&local_198,p2);
  std::filesystem::__cxx11::path::~path(&local_198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffe48,"peers",(allocator<char> *)&stack0xfffffffffffffe07)
  ;
  FastRandomContext::FastRandomContext((FastRandomContext *)&hashwriter,false);
  uVar3 = RandomMixin<FastRandomContext>::randbits<16>
                    ((RandomMixin<FastRandomContext> *)&hashwriter);
  ChaCha20::~ChaCha20((ChaCha20 *)(hashwriter.super_HashWriter.ctx.s + 4));
  randv = (uint16_t)uVar3;
  tinyformat::format<std::__cxx11::string,unsigned_short>
            (&tmpfn,(tinyformat *)"%s.%04x",&stack0xfffffffffffffe48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&randv,in_R8);
  source_line = (int)in_R8;
  ArgsManager::GetDataDirNet((path *)&local_120,&gArgs);
  fs::u8path((path *)&hashwriter,&tmpfn);
  fs::operator/(&pathTmp,(path *)&local_120,(path *)&hashwriter);
  std::filesystem::__cxx11::path::~path((path *)&hashwriter);
  std::filesystem::__cxx11::path::~path(&local_120);
  __stream = "wb";
  local_1e0._0_8_ = fsbridge::fopen((char *)&pathTmp,"wb");
  local_1e0._8_8_ = (pointer)0x0;
  local_1e0._16_8_ = (pointer)0x0;
  local_1e0._24_8_ = (pointer)0x0;
  args_00 = (char (*) [16])0x0;
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var6._M_head_impl = (_Impl *)0x0;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&stack0xfffffffffffffe08);
  if ((FILE *)local_1e0._0_8_ == (FILE *)0x0) {
    AutoFile::fclose((AutoFile *)local_1e0,(FILE *)__stream);
    std::filesystem::remove((path *)&pathTmp);
    std::filesystem::__cxx11::path::string((string *)&hashwriter,&pathTmp.super_path);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrdb.cpp";
    source_file_00._M_len = 0x53;
    logging_function_00._M_str = "SerializeFileDB";
    logging_function_00._M_len = 0xf;
    LogPrintf_<char[16],std::__cxx11::string>
              (logging_function_00,source_file_00,0x42,
               IPC|I2P|QT|LIBEVENT|CMPCTBLOCK|RPC|WALLETDB|BENCH|HTTP|NET,(Level)&hashwriter,
               in_stack_fffffffffffffe00,args_00,args_1);
LAB_006a1454:
    std::__cxx11::string::~string((string *)&hashwriter);
  }
  else {
    HashedSourceWriter<AutoFile>::HashedSourceWriter(&hashwriter,(AutoFile *)local_1e0);
    pCVar4 = Params();
    Serialize<HashedSourceWriter<AutoFile>,_unsigned_char,_4UL>
              (&hashwriter,&pCVar4->pchMessageStart);
    AddrMan::Serialize<HashedSourceWriter<AutoFile>>(addr,&hashwriter);
    HashWriter::GetHash((uint256 *)&local_148,&hashwriter.super_HashWriter);
    __stream_00 = (FILE *)local_1e0;
    base_blob<256U>::Serialize<AutoFile>((base_blob<256U> *)&local_148,(AutoFile *)__stream_00);
    bVar2 = FileCommit((FILE *)local_1e0._0_8_);
    if (!bVar2) {
      AutoFile::fclose((AutoFile *)local_1e0,__stream_00);
      std::filesystem::remove((path *)&pathTmp);
      std::filesystem::__cxx11::path::string((string *)&hashwriter,&pathTmp.super_path);
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrdb.cpp";
      source_file_01._M_len = 0x53;
      logging_function_01._M_str = "SerializeFileDB";
      logging_function_01._M_len = 0xf;
      LogPrintf_<char[16],std::__cxx11::string>
                (logging_function_01,source_file_01,0x4f,
                 IPC|I2P|QT|LIBEVENT|CMPCTBLOCK|RPC|WALLETDB|ZMQ|BENCH|MEMPOOL|NET,
                 (Level)&hashwriter,in_stack_fffffffffffffe00,args_00,args_1);
      goto LAB_006a1454;
    }
    AutoFile::fclose((AutoFile *)local_1e0,__stream_00);
    std::filesystem::__cxx11::path::path((path *)&hashwriter,&pathTmp.super_path);
    std::filesystem::__cxx11::path::path(&local_148,&pathAddr.super_path);
    src.super_path._M_pathname._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffdfc;
    src.super_path._M_pathname._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffdf8;
    src.super_path._M_pathname._M_string_length = (size_type)in_stack_fffffffffffffe00;
    src.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)args_00;
    src.super_path._M_pathname.field_2._8_8_ = args_1;
    src.super_path._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )_Var6._M_head_impl;
    dest.super_path._M_pathname._M_string_length = local_1e0._8_8_;
    dest.super_path._M_pathname._M_dataplus._M_p = (pointer)local_1e0._0_8_;
    dest.super_path._M_pathname.field_2._M_allocated_capacity = local_1e0._16_8_;
    dest.super_path._M_pathname.field_2._8_8_ = local_1e0._24_8_;
    dest.super_path._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._0_6_
         = local_1e0._32_6_;
    dest.super_path._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._6_2_
         = randv;
    bVar2 = RenameOver(src,dest);
    std::filesystem::__cxx11::path::~path(&local_148);
    std::filesystem::__cxx11::path::~path((path *)&hashwriter);
    bVar5 = true;
    if (bVar2) goto LAB_006a1463;
    std::filesystem::remove((path *)&pathTmp);
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrdb.cpp";
    source_file._M_len = 0x53;
    logging_function._M_str = "SerializeFileDB";
    logging_function._M_len = 0xf;
    LogPrintf_<char[16]>
              (logging_function,source_file,source_line,in_R9,in_stack_fffffffffffffdf8,
               in_stack_fffffffffffffe00,args_00);
  }
  bVar5 = false;
LAB_006a1463:
  AutoFile::~AutoFile((AutoFile *)local_1e0);
  std::filesystem::__cxx11::path::~path(&pathTmp.super_path);
  std::__cxx11::string::~string((string *)&tmpfn);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
  std::filesystem::__cxx11::path::~path(&pathAddr.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool DumpPeerAddresses(const ArgsManager& args, const AddrMan& addr)
{
    const auto pathAddr = args.GetDataDirNet() / "peers.dat";
    return SerializeFileDB("peers", pathAddr, addr);
}